

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valgen.cpp
# Opt level: O2

bool have_palette_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *this;
  Am_Object window;
  Am_Object local_10;
  
  Am_Object::Get_Object(&local_10,(Am_Slot_Key)self,0x170);
  Am_Object::Get_Owner(&window,(Am_Slot_Flags)&local_10);
  Am_Object::~Am_Object(&local_10);
  this = Am_Object::Get(&window,Am_REGISTRY_FOR_PALETTES,1);
  bVar1 = Am_Value::Valid(this);
  Am_Object::~Am_Object(&window);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, have_palette)
{
  Am_Object window = self.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  return (window.Peek(Am_REGISTRY_FOR_PALETTES).Valid());
}